

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_negate(secp256k1_context *ctx,uchar *seckey)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  undefined1 local_48 [72];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_negate_cold_2();
  }
  else if (seckey != (uchar *)0x0) {
    lVar5 = 0;
    bVar3 = false;
    uVar7 = 0;
    do {
      uVar7 = (uint)seckey[lVar5] | uVar7 << 8;
      if (0xc < uVar7) {
        bVar3 = true;
        uVar7 = uVar7 - (uVar7 / 0xd + (uVar7 / 0xd) * 0xc);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    uVar6 = (uint)(uVar7 != 0 && !bVar3);
    uVar1 = (ulong)((long)local_48 * 8) >> 0x33;
    uVar2 = (((long)local_48 * 8 | (ulong)local_48 >> 0x3d) << 0xd | uVar1) >> 3;
    puVar8 = (uint *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd);
    uVar4 = (uVar6 ^ 1) - 1 & *puVar8;
    uVar7 = 0xd - uVar4;
    if (uVar4 == 0) {
      uVar7 = 0;
    }
    *puVar8 = uVar4;
    *puVar8 = uVar7;
    seckey[0x10] = '\0';
    seckey[0x11] = '\0';
    seckey[0x12] = '\0';
    seckey[0x13] = '\0';
    seckey[0x14] = '\0';
    seckey[0x15] = '\0';
    seckey[0x16] = '\0';
    seckey[0x17] = '\0';
    seckey[0x18] = '\0';
    seckey[0x19] = '\0';
    seckey[0x1a] = '\0';
    seckey[0x1b] = '\0';
    seckey[0x1c] = '\0';
    seckey[0x1d] = '\0';
    seckey[0x1e] = '\0';
    seckey[0x1f] = '\0';
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    *(uint *)(seckey + 0x1c) =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    *puVar8 = 0;
    return uVar6;
  }
  secp256k1_ec_seckey_negate_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}